

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O3

void mcmterm(mcmcx1def *ctx)

{
  mcmhdef *pmVar1;
  mcmhdef *pmVar2;
  mcmhdef *__ptr;
  
  __ptr = ctx->mcmcxhpch;
  if (__ptr != (mcmhdef *)0x0) {
    pmVar1 = __ptr->mcmhnxt;
    while (pmVar2 = pmVar1, pmVar2 != (mcmhdef *)0x0) {
      free(__ptr);
      __ptr = pmVar2;
      pmVar1 = pmVar2->mcmhnxt;
    }
  }
  free(ctx);
  return;
}

Assistant:

void mcmterm(mcmcx1def *ctx)
{
    mcmhdef *cur, *nxt;
    
    /* 
     *   Free each chunk in the cache block list, *except* the last one.  The
     *   last one is special: it's actually the first chunk allocated, since
     *   we build the list in reverse order, and the first chunk pointer
     *   points into the middle of the actual allocation block, since we
     *   sub-allocated the context structure itself and the page table out of
     *   that memory. 
     */
    for (cur = ctx->mcmcxhpch ; cur != 0 && cur->mcmhnxt != 0 ; cur = nxt)
    {
        /* remember the next chunk, and delete this one */
        nxt = cur->mcmhnxt;
        mchfre(cur);
    }

    /* 
     *   As described above, the last chunk in the list is the first
     *   allocated, and it points into the middle of the actual allocated
     *   memory block.  Luckily, we do have a handy pointer to the start of
     *   the memory block, namely the context pointer - it's the first thing
     *   allocated out of the block, so it's the same as the block pointer.
     *   Freeing the context frees this last/first chunk. 
     */
    mchfre(ctx);
}